

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O2

string * capitalize(string *__return_storage_ptr__,string *s,int pos)

{
  byte *pbVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  if (pos == -1) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar3 = __return_storage_ptr__->_M_string_length;
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      iVar4 = toupper((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar4;
    }
  }
  else {
    pbVar1 = (byte *)((__return_storage_ptr__->_M_dataplus)._M_p + pos);
    *pbVar1 = *pbVar1 ^ 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string capitalize(const std::string &s, int pos) {
  std::string ret = s;
  if (pos == -1) {
      std::transform(ret.begin(), ret.end(),ret.begin(), ::toupper);
      return ret;
  }

  ret[pos] ^= 32;
  return ret;
}